

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::write_response_line(Stream *strm,int status)

{
  int iVar1;
  undefined4 extraout_var;
  string s;
  undefined8 local_50;
  undefined8 local_48;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"HTTP/1.1 ",(allocator<char> *)&local_30);
  std::__cxx11::to_string(&local_30,status);
  ::std::__cxx11::string::append((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)&local_50);
  status_message(status);
  ::std::__cxx11::string::append((char *)&local_50);
  ::std::__cxx11::string::append((char *)&local_50);
  iVar1 = (*strm->_vptr_Stream[6])(strm,local_50,local_48);
  ::std::__cxx11::string::~string((string *)&local_50);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

inline ssize_t write_response_line(Stream &strm, int status) {
  std::string s = "HTTP/1.1 ";
  s += std::to_string(status);
  s += " ";
  s += httplib::status_message(status);
  s += "\r\n";
  return strm.write(s.data(), s.size());
}